

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesQueueBindSparseTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::sparse::anon_unknown_2::SparseQueueBindTestInstance::iterate
          (TestStatus *__return_storage_ptr__,SparseQueueBindTestInstance *this)

{
  deUint32 dVar1;
  deUint32 numSignalSemaphores;
  Queue *pQVar2;
  VkQueue pVVar3;
  pointer ppQVar4;
  bool bVar5;
  VkResult VVar6;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  NotSupportedError *this_00;
  DeviceInterface *vk_01;
  VkDevice pVVar7;
  reference pvVar8;
  RefBase<vk::Handle<(vk::HandleType)4>_> *pRVar9;
  Handle<(vk::HandleType)4> *pHVar10;
  size_type sVar11;
  Handle<(vk::HandleType)4> *pSignalSemaphore;
  uint *puVar12;
  reference ppQVar13;
  pointer pQVar14;
  reference pvVar15;
  RefBase<vk::Handle<(vk::HandleType)6>_> *pRVar16;
  Handle<(vk::HandleType)6> *pHVar17;
  allocator<char> local_651;
  string local_650;
  allocator<char> local_629;
  string local_628;
  int local_608;
  allocator<char> local_601;
  string local_600;
  deUint64 local_5e0;
  Move<vk::Handle<(vk::HandleType)6>_> local_5d8;
  value_type local_5b8;
  deUint64 local_5a8;
  deUint64 local_5a0;
  Move<vk::Handle<(vk::HandleType)6>_> local_598;
  value_type local_578;
  Handle<(vk::HandleType)6> local_568;
  VkFence fence;
  __normal_iterator<vkt::sparse::(anonymous_namespace)::QueueSubmission_*,_std::vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>_>
  local_558;
  __normal_iterator<const_vkt::sparse::(anonymous_namespace)::QueueSubmission_*,_std::vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>_>
  local_550;
  const_iterator submissionIter;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  bindSparseFences;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  regularFences;
  QueueSubmission local_4a8;
  deUint32 local_438;
  int local_434;
  deUint32 numSemaphores_1;
  deUint32 numQueues_1;
  QueueSubmission local_3c0;
  QueueSubmission local_350;
  QueueSubmission local_2e0;
  deUint32 local_26c;
  int local_268;
  deUint32 numSemaphores;
  deUint32 numQueues;
  value_type local_240;
  uint local_22c;
  undefined1 local_228 [4];
  deUint32 i_1;
  value_type local_208;
  uint local_1f4;
  undefined1 local_1f0 [4];
  deUint32 i;
  vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
  queueSubmissions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> signalSemaphoresWaitDstStageMask;
  vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
  signalSemaphores;
  vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
  waitSemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  allSemaphores;
  DeviceInterface *vk;
  Queue *queue;
  deUint32 queueNdx;
  QueueRequirements local_158;
  undefined1 local_150 [8];
  QueueRequirementsVec requirements;
  VkPhysicalDeviceFeatures local_124;
  undefined1 local_48 [8];
  vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_> otherQueues;
  Queue *sparseQueue;
  VkPhysicalDevice physDevice;
  InstanceInterface *vki;
  SparseQueueBindTestInstance *this_local;
  
  vk_00 = Context::getInstanceInterface
                    ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  physicalDevice =
       Context::getPhysicalDevice
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  otherQueues.
  super__Vector_base<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>::vector
            ((vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_> *)
             local_48);
  ::vk::getPhysicalDeviceFeatures(&local_124,vk_00,physicalDevice);
  if (local_124.sparseBinding != 0) {
    std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
    vector((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
            *)local_150);
    QueueRequirements::QueueRequirements(&local_158,8,1);
    std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
    push_back((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
               *)local_150,&local_158);
    QueueRequirements::QueueRequirements
              ((QueueRequirements *)&stack0xfffffffffffffea0,0,(this->m_params).numQueues);
    std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
    push_back((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
               *)local_150,(value_type *)&stack0xfffffffffffffea0);
    SparseResourcesBaseInstance::createDeviceSupportingQueues
              (&this->super_SparseResourcesBaseInstance,(QueueRequirementsVec *)local_150);
    otherQueues.
    super__Vector_base<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)SparseResourcesBaseInstance::getQueue
                            (&this->super_SparseResourcesBaseInstance,8,0);
    for (queue._4_4_ = 0; queue._4_4_ < (this->m_params).numQueues; queue._4_4_ = queue._4_4_ + 1) {
      vk = (DeviceInterface *)
           SparseResourcesBaseInstance::getQueue
                     (&this->super_SparseResourcesBaseInstance,0,queue._4_4_);
      if ((Queue *)((Queue *)vk)->queueHandle !=
          *otherQueues.
           super__Vector_base<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>::
        push_back((vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_> *
                  )local_48,(value_type *)&vk);
      }
    }
    std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
    ~vector((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
             *)local_150);
    vk_01 = SparseResourcesBaseInstance::getDeviceInterface
                      (&this->super_SparseResourcesBaseInstance);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
              *)&waitSemaphores.
                 super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_> *
           )&signalSemaphores.
             super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_> *
           )&signalSemaphoresWaitDstStageMask.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &queueSubmissions.
                super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
    ::vector((vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
              *)local_1f0);
    for (local_1f4 = 0; local_1f4 < (this->m_params).numWaitSemaphores; local_1f4 = local_1f4 + 1) {
      pVVar7 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
      ::vk::createSemaphore
                ((Move<vk::Handle<(vk::HandleType)4>_> *)local_228,vk_01,pVVar7,0,
                 (VkAllocationCallbacks *)0x0);
      makeVkSharedPtr<vk::Handle<(vk::HandleType)4>>
                ((sparse *)&local_208,(Move<vk::Handle<(vk::HandleType)4>_> *)local_228);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
      ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                   *)&waitSemaphores.
                      super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_208);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>::~SharedPtr(&local_208)
      ;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::~Move
                ((Move<vk::Handle<(vk::HandleType)4>_> *)local_228);
      pvVar8 = std::
               vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
               ::back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                       *)&waitSemaphores.
                          super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pRVar9 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>::operator*
                          (pvVar8)->super_RefBase<vk::Handle<(vk::HandleType)4>_>;
      pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::operator*(pRVar9);
      std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
      push_back((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                 *)&signalSemaphores.
                    super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pHVar10);
    }
    for (local_22c = 0; local_22c < (this->m_params).numSignalSemaphores; local_22c = local_22c + 1)
    {
      pVVar7 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
      ::vk::createSemaphore
                ((Move<vk::Handle<(vk::HandleType)4>_> *)&numQueues,vk_01,pVVar7,0,
                 (VkAllocationCallbacks *)0x0);
      makeVkSharedPtr<vk::Handle<(vk::HandleType)4>>
                ((sparse *)&local_240,(Move<vk::Handle<(vk::HandleType)4>_> *)&numQueues);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
      ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                   *)&waitSemaphores.
                      super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_240);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>::~SharedPtr(&local_240)
      ;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::~Move
                ((Move<vk::Handle<(vk::HandleType)4>_> *)&numQueues);
      pvVar8 = std::
               vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
               ::back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                       *)&waitSemaphores.
                          super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pRVar9 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>::operator*
                          (pvVar8)->super_RefBase<vk::Handle<(vk::HandleType)4>_>;
      pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::operator*(pRVar9);
      std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
      push_back((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                 *)&signalSemaphoresWaitDstStageMask.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,pHVar10);
      numSemaphores = 0x10000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &queueSubmissions.
                  super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&numSemaphores);
    }
    sVar11 = std::vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>::
             size((vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_> *
                  )local_48);
    local_268 = (int)sVar11 + 1;
    local_26c = (this->m_params).numWaitSemaphores;
    while (ppQVar4 = otherQueues.
                     super__Vector_base<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage, dVar1 = local_26c,
          local_26c != 0 && local_268 != 0) {
      if (local_268 == 1) {
        pHVar10 = getDataOrNullptr<vk::Handle<(vk::HandleType)4>>
                            ((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                              *)&signalSemaphores.
                                 super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        makeSubmissionRegular
                  (&local_2e0,(Queue *)ppQVar4,0,(VkSemaphore *)0x0,(VkPipelineStageFlags *)0x0,
                   dVar1,pHVar10);
        std::
        vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
        ::push_back((vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                     *)local_1f0,&local_2e0);
        local_26c = 0;
        local_268 = 0;
      }
      else {
        ppQVar13 = std::
                   vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>::
                   operator[]((vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>
                               *)local_48,(ulong)(local_268 - 2));
        pQVar2 = *ppQVar13;
        pHVar10 = getDataOrNullptr<vk::Handle<(vk::HandleType)4>>
                            ((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                              *)&signalSemaphores.
                                 super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (ulong)(local_26c - 1));
        makeSubmissionRegular
                  (&local_350,pQVar2,0,(VkSemaphore *)0x0,(VkPipelineStageFlags *)0x0,1,pHVar10);
        std::
        vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
        ::push_back((vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                     *)local_1f0,&local_350);
        local_268 = local_268 + -1;
        local_26c = local_26c - 1;
      }
    }
    if (((this->m_params).emptySubmission & 1U) == 0) {
      dVar1 = (this->m_params).numWaitSemaphores;
      pHVar10 = getDataOrNullptr<vk::Handle<(vk::HandleType)4>>
                          ((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                            *)&signalSemaphores.
                               super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      numSignalSemaphores = (this->m_params).numSignalSemaphores;
      pSignalSemaphore =
           getDataOrNullptr<vk::Handle<(vk::HandleType)4>>
                     ((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                       *)&signalSemaphoresWaitDstStageMask.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
      makeSubmissionSparse
                (&local_3c0,(Queue *)ppQVar4,dVar1,pHVar10,numSignalSemaphores,pSignalSemaphore);
      std::
      vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
      ::push_back((vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                   *)local_1f0,&local_3c0);
    }
    else {
      makeSubmissionSparse
                ((QueueSubmission *)&numSemaphores_1,
                 (Queue *)otherQueues.
                          super__Vector_base<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,0,(VkSemaphore *)0x0,0,
                 (VkSemaphore *)0x0);
      std::
      vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
      ::push_back((vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                   *)local_1f0,(value_type *)&numSemaphores_1);
    }
    if (((this->m_params).emptySubmission & 1U) == 0) {
      sVar11 = std::vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>
               ::size((vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>
                       *)local_48);
      local_434 = (int)sVar11 + 1;
      local_438 = (this->m_params).numSignalSemaphores;
      while (ppQVar4 = otherQueues.
                       super__Vector_base<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage, dVar1 = local_438,
            local_438 != 0 && local_434 != 0) {
        if (local_434 == 1) {
          pHVar10 = getDataOrNullptr<vk::Handle<(vk::HandleType)4>>
                              ((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                                *)&signalSemaphoresWaitDstStageMask.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,0);
          puVar12 = getDataOrNullptr<unsigned_int>
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &queueSubmissions.
                                super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          makeSubmissionRegular
                    (&local_4a8,(Queue *)ppQVar4,dVar1,pHVar10,puVar12,0,(VkSemaphore *)0x0);
          std::
          vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
          ::push_back((vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                       *)local_1f0,&local_4a8);
          local_438 = 0;
          local_434 = 0;
        }
        else {
          ppQVar13 = std::
                     vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>
                     ::operator[]((vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>
                                   *)local_48,(ulong)(local_434 - 2));
          pQVar2 = *ppQVar13;
          pHVar10 = getDataOrNullptr<vk::Handle<(vk::HandleType)4>>
                              ((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                                *)&signalSemaphoresWaitDstStageMask.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)(local_438 - 1));
          puVar12 = getDataOrNullptr<unsigned_int>
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &queueSubmissions.
                                super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)(local_438 - 1));
          makeSubmissionRegular
                    ((QueueSubmission *)
                     &regularFences.
                      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,pQVar2,1,pHVar10,puVar12,0,
                     (VkSemaphore *)0x0);
          std::
          vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
          ::push_back((vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                       *)local_1f0,
                      (value_type *)
                      &regularFences.
                       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_434 = local_434 + -1;
          local_438 = local_438 - 1;
        }
      }
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
              *)&bindSparseFences.
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
              *)&submissionIter);
    local_558._M_current =
         (QueueSubmission *)
         std::
         vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
         ::begin((vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                  *)local_1f0);
    __gnu_cxx::
    __normal_iterator<vkt::sparse::(anonymous_namespace)::QueueSubmission_const*,std::vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>>>
    ::__normal_iterator<vkt::sparse::(anonymous_namespace)::QueueSubmission*>
              ((__normal_iterator<vkt::sparse::(anonymous_namespace)::QueueSubmission_const*,std::vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>>>
                *)&local_550,&local_558);
    while( true ) {
      fence.m_internal =
           (deUint64)
           std::
           vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
           ::end((vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                  *)local_1f0);
      bVar5 = __gnu_cxx::operator!=
                        (&local_550,
                         (__normal_iterator<vkt::sparse::(anonymous_namespace)::QueueSubmission_*,_std::vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>_>
                          *)&fence);
      if (!bVar5) break;
      pQVar14 = __gnu_cxx::
                __normal_iterator<const_vkt::sparse::(anonymous_namespace)::QueueSubmission_*,_std::vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>_>
                ::operator->(&local_550);
      if ((pQVar14->isSparseBinding & 1U) == 0) {
        pVVar7 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
        ::vk::createFence(&local_5d8,vk_01,pVVar7,0,(VkAllocationCallbacks *)0x0);
        makeVkSharedPtr<vk::Handle<(vk::HandleType)6>>((sparse *)&local_5b8,&local_5d8);
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
        ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                     *)&bindSparseFences.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_5b8);
        de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>::~SharedPtr
                  (&local_5b8);
        ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&local_5d8);
        pQVar14 = __gnu_cxx::
                  __normal_iterator<const_vkt::sparse::(anonymous_namespace)::QueueSubmission_*,_std::vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>_>
                  ::operator->(&local_550);
        pVVar3 = pQVar14->queue->queueHandle;
        pQVar14 = __gnu_cxx::
                  __normal_iterator<const_vkt::sparse::(anonymous_namespace)::QueueSubmission_*,_std::vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>_>
                  ::operator->(&local_550);
        pvVar15 = std::
                  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                  ::back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                          *)&bindSparseFences.
                             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pRVar16 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>::operator*
                             (pvVar15)->super_RefBase<vk::Handle<(vk::HandleType)6>_>;
        pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*(pRVar16);
        local_5e0 = pHVar17->m_internal;
        VVar6 = (*vk_01->_vptr_DeviceInterface[2])(vk_01,pVVar3,1,&pQVar14->info,local_5e0);
        ::vk::checkResult(VVar6,
                          "vk.queueSubmit(submissionIter->queue->queueHandle, 1u, &submissionIter->info.regular, **regularFences.back())"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesQueueBindSparseTests.cpp"
                          ,0x124);
      }
      else {
        ::vk::Handle<(vk::HandleType)6>::Handle(&local_568,0);
        if (((this->m_params).bindSparseUseFence & 1U) != 0) {
          pVVar7 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
          ::vk::createFence(&local_598,vk_01,pVVar7,0,(VkAllocationCallbacks *)0x0);
          makeVkSharedPtr<vk::Handle<(vk::HandleType)6>>((sparse *)&local_578,&local_598);
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
          ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                       *)&submissionIter,&local_578);
          de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>::~SharedPtr
                    (&local_578);
          ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&local_598);
          pvVar15 = std::
                    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                    ::back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                            *)&submissionIter);
          pRVar16 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>::
                     operator*(pvVar15)->super_RefBase<vk::Handle<(vk::HandleType)6>_>;
          pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*(pRVar16);
          local_568.m_internal = pHVar17->m_internal;
        }
        if (((this->m_params).emptySubmission & 1U) == 0) {
          pQVar14 = __gnu_cxx::
                    __normal_iterator<const_vkt::sparse::(anonymous_namespace)::QueueSubmission_*,_std::vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>_>
                    ::operator->(&local_550);
          pVVar3 = pQVar14->queue->queueHandle;
          pQVar14 = __gnu_cxx::
                    __normal_iterator<const_vkt::sparse::(anonymous_namespace)::QueueSubmission_*,_std::vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>_>
                    ::operator->(&local_550);
          local_5a8 = local_568.m_internal;
          VVar6 = (*vk_01->_vptr_DeviceInterface[0x11])
                            (vk_01,pVVar3,1,&pQVar14->info,local_568.m_internal);
          ::vk::checkResult(VVar6,
                            "vk.queueBindSparse(submissionIter->queue->queueHandle, 1u, &submissionIter->info.sparse, fence)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesQueueBindSparseTests.cpp"
                            ,0x11f);
        }
        else {
          pQVar14 = __gnu_cxx::
                    __normal_iterator<const_vkt::sparse::(anonymous_namespace)::QueueSubmission_*,_std::vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>_>
                    ::operator->(&local_550);
          local_5a0 = local_568.m_internal;
          VVar6 = (*vk_01->_vptr_DeviceInterface[0x11])
                            (vk_01,pQVar14->queue->queueHandle,0,0,local_568.m_internal);
          ::vk::checkResult(VVar6,
                            "vk.queueBindSparse(submissionIter->queue->queueHandle, 0u, DE_NULL, fence)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesQueueBindSparseTests.cpp"
                            ,0x11d);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_vkt::sparse::(anonymous_namespace)::QueueSubmission_*,_std::vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>_>
      ::operator++(&local_550);
    }
    pVVar7 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    bVar5 = waitForFences(vk_01,pVVar7,
                          (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                           *)&submissionIter);
    if (bVar5) {
      pVVar7 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
      bVar5 = waitForFences(vk_01,pVVar7,
                            (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                             *)&bindSparseFences.
                                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar5) {
        local_608 = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_628,
                   "Some fences weren\'t signaled (vkQueueBindSparse didn\'t signal semaphores?)",
                   &local_629);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_628);
        std::__cxx11::string::~string((string *)&local_628);
        std::allocator<char>::~allocator(&local_629);
        local_608 = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_600,"vkQueueBindSparse didn\'t signal the fence",&local_601);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_600);
      std::__cxx11::string::~string((string *)&local_600);
      std::allocator<char>::~allocator(&local_601);
      local_608 = 1;
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
               *)&submissionIter);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
               *)&bindSparseFences.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_608 == 0) {
      pVVar7 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
      VVar6 = (*vk_01->_vptr_DeviceInterface[4])(vk_01,pVVar7);
      ::vk::checkResult(VVar6,"vk.deviceWaitIdle(getDevice())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesQueueBindSparseTests.cpp"
                        ,0x130);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_650,"Pass",&local_651);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_650);
      std::__cxx11::string::~string((string *)&local_650);
      std::allocator<char>::~allocator(&local_651);
      local_608 = 1;
    }
    std::
    vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
    ::~vector((vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
               *)local_1f0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &queueSubmissions.
                super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    ~vector((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
             *)&signalSemaphoresWaitDstStageMask.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    ~vector((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
             *)&signalSemaphores.
                super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
               *)&waitSemaphores.
                  super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>::~vector
              ((vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_> *)
               local_48);
    return __return_storage_ptr__;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Sparse binding not supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesQueueBindSparseTests.cpp"
             ,0xa3);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const InstanceInterface&	vki				= m_context.getInstanceInterface();
		const VkPhysicalDevice		physDevice		= m_context.getPhysicalDevice();
		const Queue*				sparseQueue		= DE_NULL;
		std::vector<const Queue*>	otherQueues;

		if (!getPhysicalDeviceFeatures(vki, physDevice).sparseBinding)
			TCU_THROW(NotSupportedError, "Sparse binding not supported");

		// Determine required queues and create a device that supports them
		{
			QueueRequirementsVec requirements;
			requirements.push_back(QueueRequirements(VK_QUEUE_SPARSE_BINDING_BIT, 1u));
			requirements.push_back(QueueRequirements((VkQueueFlags)0, m_params.numQueues));		// any queue flags

			createDeviceSupportingQueues(requirements);

			sparseQueue = &getQueue(VK_QUEUE_SPARSE_BINDING_BIT, 0u);

			// We probably have picked the sparse queue again, so filter it out
			for (deUint32 queueNdx = 0u; queueNdx < m_params.numQueues; ++queueNdx)
			{
				const Queue* queue = &getQueue((VkQueueFlags)0, queueNdx);
				if (queue->queueHandle != sparseQueue->queueHandle)
					otherQueues.push_back(queue);
			}
		}

		const DeviceInterface&				vk = getDeviceInterface();

		std::vector<SemaphoreSp>			allSemaphores;
		std::vector<VkSemaphore>			waitSemaphores;
		std::vector<VkSemaphore>			signalSemaphores;
		std::vector<VkPipelineStageFlags>	signalSemaphoresWaitDstStageMask;
		std::vector<QueueSubmission>		queueSubmissions;

		for (deUint32 i = 0; i < m_params.numWaitSemaphores; ++i)
		{
			allSemaphores.push_back(makeVkSharedPtr(createSemaphore(vk, getDevice())));
			waitSemaphores.push_back(**allSemaphores.back());
		}

		for (deUint32 i = 0; i < m_params.numSignalSemaphores; ++i)
		{
			allSemaphores.push_back(makeVkSharedPtr(createSemaphore(vk, getDevice())));
			signalSemaphores.push_back(**allSemaphores.back());
			signalSemaphoresWaitDstStageMask.push_back(VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
		}

		// Prepare submissions: signal semaphores for the sparse bind operation
		{
			deUint32 numQueues		= 1u + static_cast<deUint32>(otherQueues.size());
			deUint32 numSemaphores	= m_params.numWaitSemaphores;

			while (numSemaphores > 0u && numQueues > 0u)
			{
				if (numQueues == 1u)	// sparse queue is assigned last
				{
					// sparse queue can handle regular submissions as well
					queueSubmissions.push_back(makeSubmissionRegular(
						sparseQueue, 0u, DE_NULL, DE_NULL, numSemaphores, getDataOrNullptr(waitSemaphores)));
					numSemaphores	= 0u;
					numQueues		= 0u;
				}
				else
				{
					queueSubmissions.push_back(makeSubmissionRegular(
						otherQueues[numQueues - 2], 0u, DE_NULL, DE_NULL, 1u, getDataOrNullptr(waitSemaphores, numSemaphores - 1)));
					--numQueues;
					--numSemaphores;
				}
			}
		}

		// Prepare submission: bind sparse
		if (!m_params.emptySubmission)
		{
			queueSubmissions.push_back(makeSubmissionSparse(
				sparseQueue, m_params.numWaitSemaphores, getDataOrNullptr(waitSemaphores), m_params.numSignalSemaphores, getDataOrNullptr(signalSemaphores)));
		}
		else
		{
			// a dummy submission, won't be used in a call to vkQueueBindSparse
			queueSubmissions.push_back(makeSubmissionSparse(sparseQueue, 0u, DE_NULL, 0u, DE_NULL));
		}

		// Prepare submissions: wait on semaphores signaled by the sparse bind operation
		if (!m_params.emptySubmission)
		{
			deUint32 numQueues		= 1u + static_cast<deUint32>(otherQueues.size());
			deUint32 numSemaphores	= m_params.numSignalSemaphores;

			while (numSemaphores > 0u && numQueues > 0u)
			{
				if (numQueues == 1u)
				{
					queueSubmissions.push_back(makeSubmissionRegular(
						sparseQueue, numSemaphores, getDataOrNullptr(signalSemaphores), getDataOrNullptr(signalSemaphoresWaitDstStageMask), 0u, DE_NULL));
					numSemaphores	= 0u;
					numQueues		= 0u;
				}
				else
				{
					queueSubmissions.push_back(makeSubmissionRegular(
						otherQueues[numQueues - 2], 1u, getDataOrNullptr(signalSemaphores, numSemaphores - 1), getDataOrNullptr(signalSemaphoresWaitDstStageMask, numSemaphores - 1), 0u, DE_NULL));
					--numQueues;
					--numSemaphores;
				}
			}
		}

		// Submit to queues
		{
			std::vector<FenceSp>	regularFences;
			std::vector<FenceSp>	bindSparseFences;

			for (std::vector<QueueSubmission>::const_iterator submissionIter = queueSubmissions.begin(); submissionIter != queueSubmissions.end(); ++submissionIter)
			{
				if (submissionIter->isSparseBinding)
				{
					VkFence fence = DE_NULL;

					if (m_params.bindSparseUseFence)
					{
						bindSparseFences.push_back(makeVkSharedPtr(createFence(vk, getDevice())));
						fence = **bindSparseFences.back();
					}

					if (m_params.emptySubmission)
						VK_CHECK(vk.queueBindSparse(submissionIter->queue->queueHandle, 0u, DE_NULL, fence));
					else
						VK_CHECK(vk.queueBindSparse(submissionIter->queue->queueHandle, 1u, &submissionIter->info.sparse, fence));
				}
				else
				{
					regularFences.push_back(makeVkSharedPtr(createFence(vk, getDevice())));
					VK_CHECK(vk.queueSubmit(submissionIter->queue->queueHandle, 1u, &submissionIter->info.regular, **regularFences.back()));
				}
			}

			if (!waitForFences(vk, getDevice(), bindSparseFences))
				return tcu::TestStatus::fail("vkQueueBindSparse didn't signal the fence");

			if (!waitForFences(vk, getDevice(), regularFences))
				return tcu::TestStatus::fail("Some fences weren't signaled (vkQueueBindSparse didn't signal semaphores?)");
		}

		// May return an error if some waitSemaphores didn't get signaled
		VK_CHECK(vk.deviceWaitIdle(getDevice()));

		return tcu::TestStatus::pass("Pass");
	}